

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
::find_in_range<std::__cxx11::string>
          (basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
           *this,range_type *r,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  undefined8 *in_RSI;
  are_equal compare;
  iterator p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  are_equal *in_stack_ffffffffffffffd0;
  iterator local_28;
  
  local_28 = (iterator)*in_RSI;
  while( true ) {
    if (local_28 == (iterator)0x0) {
      return (iterator)0x0;
    }
    bVar1 = are_equal::operator()
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x44806c
                      );
    if (bVar1) break;
    if (local_28 == (iterator)in_RSI[1]) {
      return (iterator)0x0;
    }
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

iterator find_in_range(range_type &r,Kt const &k)
	{
		for(iterator p=r.first;p!=0;p=p->next) {
			Equals compare;
			if(compare(p->val.first,k)) {
				return p;
			}
			if(p==r.second)
				return 0;
		}
		return 0;
	}